

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O3

Ptr __thiscall
TgBot::TgTypeParser::parseJsonAndGetInlineQueryResultPhoto(TgTypeParser *this,ptree *data)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  self_type *psVar3;
  optional<int> oVar4;
  int iVar5;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  string *psVar7;
  Ptr PVar8;
  path_type local_d0;
  undefined1 local_a0 [8];
  dummy_u local_98;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  TgTypeParser *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  *(undefined8 *)this = 0;
  local_58 = this + 8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TgBot::InlineQueryResultPhoto,std::allocator<TgBot::InlineQueryResultPhoto>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_58,(InlineQueryResultPhoto **)this,
             (allocator<TgBot::InlineQueryResultPhoto> *)&local_d0);
  paVar1 = &local_d0.m_value.field_2;
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"photo_url","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_a0,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_d0);
  psVar7 = (string *)&local_78;
  if (local_a0[0] != (string)0x0) {
    psVar7 = (string *)(local_a0 + 8);
  }
  plVar2 = &local_70;
  if (local_a0[0] != (string)0x0) {
    plVar2 = (long *)(local_a0 + 0x10);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,*(long *)psVar7,*plVar2 + *(long *)psVar7);
  if ((local_a0[0] == (string)0x1) && (local_98.aligner_ != (type)((long)local_a0 + 0x18))) {
    operator_delete((void *)local_98.aligner_);
  }
  std::__cxx11::string::operator=((string *)(*(long *)this + 0xa8),(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"thumb_url","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  psVar3 = boost::property_tree::
           basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::get_child(in_RDX,&local_d0);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_value<std::__cxx11::string,boost::property_tree::id_translator<std::__cxx11::string>>
            (local_a0,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                       *)psVar3);
  std::__cxx11::string::operator=((string *)(*(long *)this + 200),(string *)local_a0);
  if ((undefined1 *)CONCAT71(local_a0._1_7_,local_a0[0]) != local_a0 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_a0._1_7_,local_a0[0]));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"photo_width","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  oVar4 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<int>(in_RDX,&local_d0);
  iVar5 = 0;
  if (((ulong)oVar4.super_type & 1) != 0) {
    iVar5 = oVar4.super_type.m_storage;
  }
  *(int *)(*(long *)this + 0xe8) = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"photo_height","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  oVar4 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get_optional<int>(in_RDX,&local_d0);
  iVar5 = 0;
  if (((ulong)oVar4.super_type & 1) != 0) {
    iVar5 = oVar4.super_type.m_storage;
  }
  *(int *)(*(long *)this + 0xec) = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
  }
  local_d0.m_value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"description","");
  local_d0.m_separator = '.';
  local_d0.m_start._M_current = local_d0.m_value._M_dataplus._M_p;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get_optional<std::__cxx11::string>
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_a0,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_d0);
  psVar7 = (string *)&local_78;
  if (local_a0[0] != (string)0x0) {
    psVar7 = (string *)(local_a0 + 8);
  }
  plVar2 = &local_70;
  if (local_a0[0] != (string)0x0) {
    plVar2 = (long *)(local_a0 + 0x10);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,*(long *)psVar7,*plVar2 + *(long *)psVar7);
  if ((local_a0[0] == (string)0x1) && (local_98.aligner_ != (type)((long)local_a0 + 0x18))) {
    operator_delete((void *)local_98.aligner_);
  }
  std::__cxx11::string::operator=((string *)(*(long *)this + 0xf0),(string *)local_50);
  _Var6._M_pi = extraout_RDX;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
    _Var6._M_pi = extraout_RDX_00;
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
    _Var6._M_pi = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_value._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0.m_value._M_dataplus._M_p);
    _Var6._M_pi = extraout_RDX_02;
  }
  PVar8.super___shared_ptr<TgBot::InlineQueryResultPhoto,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var6._M_pi;
  PVar8.super___shared_ptr<TgBot::InlineQueryResultPhoto,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar8.super___shared_ptr<TgBot::InlineQueryResultPhoto,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

InlineQueryResultPhoto::Ptr TgTypeParser::parseJsonAndGetInlineQueryResultPhoto(const boost::property_tree::ptree& data) const {
    // NOTE: This function will be called by parseJsonAndGgetInlineQueryResult().
    auto result(make_shared<InlineQueryResultPhoto>());
    result->photoUrl = data.get<string>("photo_url", "");
    result->thumbUrl = data.get<string>("thumb_url");
    result->photoWidth = data.get("photo_width", 0);
    result->photoHeight = data.get("photo_height", 0);
    result->description = data.get<string>("description", "");
    return result;
}